

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void learn_with_metrics(lda *l,single_learner *base,example *ec)

{
  pointer puVar1;
  byte bVar2;
  uint32_t uVar3;
  vw *pvVar4;
  ulong uVar5;
  byte *pbVar6;
  float *pfVar7;
  ulong uVar8;
  byte *pbVar9;
  uint32_t *puVar10;
  float *pfVar11;
  uint64_t *puVar12;
  ulong *puVar13;
  bool bVar14;
  example *__range2;
  
  pvVar4 = l->all;
  if (pvVar4->passes_complete == 0) {
    base = (single_learner *)&(pvVar4->weights).sparse_weights._weight_mask;
    bVar14 = (pvVar4->weights).sparse != false;
    puVar10 = &(pvVar4->weights).dense_weights._stride_shift;
    if (bVar14) {
      puVar10 = &(pvVar4->weights).sparse_weights._stride_shift;
    }
    uVar3 = *puVar10;
    puVar12 = &(pvVar4->weights).dense_weights._weight_mask;
    if (bVar14) {
      puVar12 = (uint64_t *)base;
    }
    uVar5 = *puVar12;
    pbVar6 = (ec->super_example_predict).indices._end;
    for (pbVar9 = (ec->super_example_predict).indices._begin; pbVar9 != pbVar6; pbVar9 = pbVar9 + 1)
    {
      bVar2 = *pbVar9;
      pfVar7 = (ec->super_example_predict).feature_space[bVar2].values._end;
      puVar13 = (ec->super_example_predict).feature_space[bVar2].indicies._begin;
      for (pfVar11 = (ec->super_example_predict).feature_space[bVar2].values._begin;
          pfVar11 != pfVar7; pfVar11 = pfVar11 + 1) {
        uVar8 = (*puVar13 & uVar5) >> ((byte)uVar3 & 0x3f);
        puVar1 = (l->feature_counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8;
        *puVar1 = *puVar1 + (int)(long)*pfVar11;
        base = (single_learner *)&ec->example_counter;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((l->feature_to_example_map).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar8,&ec->example_counter);
        puVar13 = puVar13 + 1;
      }
    }
  }
  learn(l,base,ec);
  return;
}

Assistant:

void learn_with_metrics(lda &l, LEARNER::single_learner &base, example &ec)
{
  if (l.all->passes_complete == 0)
  {
    // build feature to example map
    uint64_t stride_shift = l.all->weights.stride_shift();
    uint64_t weight_mask = l.all->weights.mask();

    for (features &fs : ec)
    {
      for (features::iterator &f : fs)
      {
        uint64_t idx = (f.index() & weight_mask) >> stride_shift;
        l.feature_counts[idx] += (uint32_t)f.value();
        l.feature_to_example_map[idx].push_back(ec.example_counter);
      }
    }
  }

  learn(l, base, ec);
}